

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

void aom_img_write_nv12(aom_image_t *img,FILE *file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t __size;
  FILE *in_RSI;
  aom_image_t *in_RDI;
  size_t size;
  uchar *vbuf;
  uchar *ubuf;
  int y;
  int x;
  int h;
  int w;
  int stride;
  uchar *buf;
  uchar *local_40;
  uchar *local_38;
  int local_2c;
  int local_28;
  uchar *local_18;
  
  local_18 = in_RDI->planes[0];
  iVar3 = in_RDI->stride[0];
  iVar1 = aom_img_plane_width(in_RDI,0);
  iVar4 = 1;
  if ((in_RDI->fmt & 0x800) != AOM_IMG_FMT_NONE) {
    iVar4 = 2;
  }
  iVar2 = aom_img_plane_height(in_RDI,0);
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    fwrite(local_18,1,(long)(iVar1 * iVar4),in_RSI);
    local_18 = local_18 + iVar3;
  }
  local_38 = in_RDI->planes[1];
  local_40 = in_RDI->planes[2];
  iVar3 = 1;
  if ((in_RDI->fmt & 0x800) != AOM_IMG_FMT_NONE) {
    iVar3 = 2;
  }
  __size = (size_t)iVar3;
  iVar3 = in_RDI->stride[1];
  iVar1 = aom_img_plane_width(in_RDI,1);
  iVar4 = aom_img_plane_height(in_RDI,1);
  for (local_2c = 0; local_2c < iVar4; local_2c = local_2c + 1) {
    for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
      fwrite(local_38,__size,1,in_RSI);
      fwrite(local_40,__size,1,in_RSI);
      local_38 = local_38 + __size;
      local_40 = local_40 + __size;
    }
    local_38 = local_38 + ((long)iVar3 - (long)iVar1 * __size);
    local_40 = local_40 + ((long)iVar3 - (long)iVar1 * __size);
  }
  return;
}

Assistant:

void aom_img_write_nv12(const aom_image_t *img, FILE *file) {
  // Y plane
  const unsigned char *buf = img->planes[0];
  int stride = img->stride[0];
  int w = aom_img_plane_width(img, 0) *
          ((img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1);
  int h = aom_img_plane_height(img, 0);
  int x, y;

  for (y = 0; y < h; ++y) {
    fwrite(buf, 1, w, file);
    buf += stride;
  }

  // Interleaved U and V plane
  const unsigned char *ubuf = img->planes[1];
  const unsigned char *vbuf = img->planes[2];
  const size_t size = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;
  stride = img->stride[1];
  w = aom_img_plane_width(img, 1);
  h = aom_img_plane_height(img, 1);

  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      fwrite(ubuf, size, 1, file);
      fwrite(vbuf, size, 1, file);
      ubuf += size;
      vbuf += size;
    }
    ubuf += (stride - w * size);
    vbuf += (stride - w * size);
  }
}